

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::AddToSourceGroup
          (cmQtAutoGenInitializer *this,string *fileName,string_view genNameUpper)

{
  bool bVar1;
  const_iterator pbVar2;
  cmState *this_00;
  string *psVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  string_view text;
  string *local_2a0;
  string local_238;
  cmAlphaNum local_218;
  size_t local_1e8;
  char *pcStack_1e0;
  cmAlphaNum local_1d0;
  string local_1a0;
  string *local_180;
  cmValue local_178;
  cmValue propName;
  string *prop;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  cmAlphaNum local_148;
  size_t local_108;
  char *pcStack_100;
  cmAlphaNum local_f8;
  string *local_c8;
  string local_c0;
  string local_a0 [32];
  undefined1 local_80 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  props;
  string groupName;
  string property;
  cmSourceGroup *sourceGroup;
  string *fileName_local;
  cmQtAutoGenInitializer *this_local;
  string_view genNameUpper_local;
  
  property.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(groupName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&props._M_len);
  __range2._6_1_ = 1;
  local_c8 = &local_c0;
  local_108 = genNameUpper._M_len;
  pcStack_100 = genNameUpper._M_str;
  cmAlphaNum::cmAlphaNum(&local_f8,genNameUpper);
  cmAlphaNum::cmAlphaNum(&local_148,"_SOURCE_GROUP");
  cmStrCat<>(&local_c0,&local_f8,&local_148);
  local_c8 = (string *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"AUTOGEN_SOURCE_GROUP",(allocator<char> *)((long)&__range2 + 7));
  __range2._6_1_ = 0;
  local_80 = (undefined1  [8])&local_c0;
  props._M_array = (iterator)0x2;
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  __end2 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_80);
  pbVar2 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80);
  do {
    if (__end2 == pbVar2) {
LAB_00829b77:
      psVar3 = &local_c0;
      local_2a0 = (string *)local_80;
      do {
        local_2a0 = local_2a0 + -1;
        std::__cxx11::string::~string((string *)local_2a0);
      } while (local_2a0 != psVar3);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (property.field_2._8_8_ =
               cmMakefile::GetOrCreateSourceGroup(this->Makefile,(string *)&props._M_len),
         (cmSourceGroup *)property.field_2._8_8_ == (cmSourceGroup *)0x0)) {
        local_1e8 = genNameUpper._M_len;
        pcStack_1e0 = genNameUpper._M_str;
        cmAlphaNum::cmAlphaNum(&local_1d0,genNameUpper);
        cmAlphaNum::cmAlphaNum(&local_218," error in ");
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&props._M_len);
        text._M_len = auVar5._8_8_;
        text._M_str = (char *)psVar3;
        cmQtAutoGen::Quoted_abi_cxx11_(&local_238,auVar5._0_8_,text);
        cmStrCat<std::__cxx11::string,char[45],std::__cxx11::string>
                  (&local_1a0,&local_1d0,&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&groupName.field_2 + 8),
                   (char (*) [45])": Could not find or create the source group ",&local_238);
        cmSystemTools::Error(&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_238);
      }
      std::__cxx11::string::~string((string *)&props._M_len);
      std::__cxx11::string::~string((string *)(groupName.field_2._M_local_buf + 8));
      if (property.field_2._8_8_ != 0) {
        cmSourceGroup::AddGroupFile((cmSourceGroup *)property.field_2._8_8_,fileName);
      }
      return;
    }
    propName.Value = __end2;
    this_00 = cmMakefile::GetState(this->Makefile);
    local_180 = (string *)cmState::GetGlobalProperty(this_00,propName.Value);
    local_178 = (cmValue)local_180;
    bVar1 = cmNonempty((cmValue)local_180);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_178);
      std::__cxx11::string::operator=((string *)&props._M_len,(string *)psVar3);
      std::__cxx11::string::operator=
                ((string *)(groupName.field_2._M_local_buf + 8),(string *)propName.Value);
      goto LAB_00829b77;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

void cmQtAutoGenInitializer::AddToSourceGroup(std::string const& fileName,
                                              cm::string_view genNameUpper)
{
  cmSourceGroup* sourceGroup = nullptr;
  // Acquire source group
  {
    std::string property;
    std::string groupName;
    {
      // Prefer generator specific source group name
      std::initializer_list<std::string> const props{
        cmStrCat(genNameUpper, "_SOURCE_GROUP"), "AUTOGEN_SOURCE_GROUP"
      };
      for (std::string const& prop : props) {
        cmValue propName = this->Makefile->GetState()->GetGlobalProperty(prop);
        if (cmNonempty(propName)) {
          groupName = *propName;
          property = prop;
          break;
        }
      }
    }
    // Generate a source group on demand
    if (!groupName.empty()) {
      sourceGroup = this->Makefile->GetOrCreateSourceGroup(groupName);
      if (!sourceGroup) {
        cmSystemTools::Error(
          cmStrCat(genNameUpper, " error in ", property,
                   ": Could not find or create the source group ",
                   cmQtAutoGen::Quoted(groupName)));
      }
    }
  }
  if (sourceGroup) {
    sourceGroup->AddGroupFile(fileName);
  }
}